

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_UInt64OptionValueIsNotPositiveInt_Test::
~ValidationErrorTest_UInt64OptionValueIsNotPositiveInt_Test
          (ValidationErrorTest_UInt64OptionValueIsNotPositiveInt_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, UInt64OptionValueIsNotPositiveInt) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_UINT64 extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 negative_int_value: -5 } }",

      "foo.proto: foo.proto: OPTION_VALUE: Value must be integer, from 0 to "
      "18446744073709551615, for uint64 option \"foo\".\n");
}